

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

uchar * readEncoded(string *fileName,uchar **occurences,int *width,int *height,int *maximum)

{
  int iVar1;
  FILE *__stream;
  uchar *puVar2;
  uchar *__ptr;
  size_t sVar3;
  int iVar4;
  uchar *__ptr_00;
  
  __stream = fopen((fileName->_M_dataplus)._M_p,"rb");
  __isoc99_fscanf(__stream,"%d\n %d\n",width,height);
  __isoc99_fscanf(__stream,"%d\n",maximum);
  puts("DECODING");
  printf("Width: %d\n",(ulong)(uint)*width);
  printf("Height: %d\n",(ulong)(uint)*height);
  printf("maximum: %d\n\n",(ulong)(uint)*maximum);
  iVar4 = *height * *width;
  iVar1 = iVar4 * 3;
  if (iVar4 < 0) {
    iVar1 = -1;
  }
  if (iVar4 < 0) {
    iVar4 = -1;
  }
  puVar2 = (uchar *)operator_new__((long)iVar1);
  __ptr = (uchar *)operator_new__((long)iVar4);
  *occurences = __ptr;
  sVar3 = fread(__ptr,1,1,__stream);
  __ptr_00 = puVar2;
  while (sVar3 != 0) {
    __ptr = __ptr + 1;
    fread(__ptr_00,1,3,__stream);
    __ptr_00 = __ptr_00 + 3;
    sVar3 = fread(__ptr,1,1,__stream);
  }
  fclose(__stream);
  return puVar2;
}

Assistant:

unsigned char* readEncoded(string fileName, unsigned char** occurences, int& width, int& height, int& maximum)
{
    // open the file to read
    FILE* fr = fopen(fileName.c_str(), "rb");

    // read the width, height and maximum
    fscanf(fr, "%d\n %d\n", &width, &height);
    fscanf(fr, "%d\n", &maximum);

    // check to see if they were stored properly
    printf("DECODING\n");
    printf("Width: %d\n", width);
    printf("Height: %d\n", height);
    printf("maximum: %d\n\n", maximum);

    int size = width * height * 3;
    int sizeOccurences = width * height;

    // allocate array for pixels
    unsigned char* encodedPixels = new unsigned char[size];
    *occurences = new unsigned char[sizeOccurences];

    unsigned char* readOccurence = *occurences;
    unsigned char* readEncoded = encodedPixels;

    while (fread(readOccurence++, 1, 1, fr)) 
    {
        fread(readEncoded, 1, 3, fr);
        readEncoded += 3;
    }
    fclose(fr);
    return encodedPixels;
}